

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O1

bool __thiscall Timidity::SF2Envelope::Update(SF2Envelope *this,Voice *v)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
LAB_00328954:
  do {
    switch((this->super_MinEnvelope).stage) {
    case '\0':
      iVar1 = v->sample_count;
      dVar3 = 0.0;
      if (this->DelayTime != -32768.0) {
        dVar3 = exp2((double)this->DelayTime * 0.0008333333333333334);
      }
      if ((double)iVar1 < (double)this->SampleRate * dVar3) {
        return false;
      }
      (this->super_MinEnvelope).stage = '\x01';
      break;
    case '\x01':
      dVar4 = 0.0;
      if (this->AttackTime != -32768.0) {
        dVar4 = exp2((double)this->AttackTime * 0.0008333333333333334);
      }
      dVar3 = 1.0;
      if (0.0 < dVar4) {
        if (dVar4 <= 0.006) {
          dVar4 = 0.006;
        }
        dVar3 = (double)this->RateMul / dVar4 + (double)this->volume;
      }
      if (dVar3 < 1.0) goto LAB_00328bb7;
      this->volume = 0.0;
      this->HoldStart = v->sample_count;
      (this->super_MinEnvelope).stage = -32768.0 < this->HoldTime ^ 3;
      break;
    case '\x02':
      goto switchD_00328968_caseD_2;
    case '\x03':
      dVar3 = 0.0;
      if (this->DecayTime != -32768.0) {
        dVar3 = exp2((double)this->DecayTime * 0.0008333333333333334);
      }
      if (dVar3 <= 0.0) {
        dVar3 = (double)this->SustainLevel;
      }
      else {
        if (dVar3 <= 0.006) {
          dVar3 = 0.006;
        }
        dVar3 = (double)this->RateMul_cB / dVar3 + (double)this->volume;
      }
      dVar4 = (double)this->SustainLevel;
      if (dVar4 <= dVar3) {
        (this->super_MinEnvelope).stage = '\x04';
        (this->super_MinEnvelope).bUpdating = '\0';
        dVar3 = dVar4;
        if ((v->status & 4) == 0) {
          v->status = v->status | 2;
        }
      }
LAB_00328bb7:
      this->volume = (float)dVar3;
    case '\x04':
      return false;
    case '\x05':
      dVar3 = 0.0;
      if (this->ReleaseTime != -32768.0) {
        dVar3 = exp2((double)this->ReleaseTime * 0.0008333333333333334);
      }
      if (dVar3 <= 0.0) {
        dVar3 = 1000.0;
      }
      else {
        if (dVar3 <= 0.006) {
          dVar3 = 0.006;
        }
        dVar3 = (double)this->RateMul_cB / dVar3 + (double)this->volume;
      }
      if (dVar3 < 960.0) goto LAB_00328bb7;
      (this->super_MinEnvelope).stage = '\x06';
      v->status = v->status & 0xe1 | 0xc;
      (this->super_MinEnvelope).bUpdating = '\0';
    case '\x06':
      return true;
    default:
      dVar3 = 0.0;
      goto LAB_00328bb7;
    }
  } while( true );
switchD_00328968_caseD_2:
  iVar1 = v->sample_count;
  dVar3 = 0.0;
  iVar2 = this->HoldStart;
  if (this->HoldTime != -32768.0) {
    dVar3 = exp2((double)this->HoldTime * 0.0008333333333333334);
  }
  if ((double)(iVar1 - iVar2) < (double)this->SampleRate * dVar3) {
    return false;
  }
  (this->super_MinEnvelope).stage = '\x03';
  goto LAB_00328954;
}

Assistant:

bool SF2Envelope::Update(Voice *v)
{
	double sec;
	double newvolume = 0;

	// NOTE! The volume scale is different for different stages of the
	// envelope generator:
	// Attack stage goes from 0.0 -> 1.0, multiplied directly to the output.
	// The following stages go from 0 -> -1000 cB (but recorded positively)
	switch (stage)
	{
	case SF2_DELAY:
		if (v->sample_count >= timecent_to_sec(DelayTime) * SampleRate)
		{
			stage = SF2_ATTACK;
			return Update(v);
		}
		return 0;

	case SF2_ATTACK:
		sec = timecent_to_sec(AttackTime);
		if (sec <= 0)
		{ // instantaneous attack
			newvolume = 1;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul, sec);
		}
		if (newvolume >= 1)
		{
			volume = 0;
			HoldStart = v->sample_count;
			if (HoldTime <= -32768)
			{ // hold time is 0, so skip right to decay
				stage = SF2_DECAY;
			}
			else
			{
				stage = SF2_HOLD;
			}
			return Update(v);
		}
		break;

	case SF2_HOLD:
		if (v->sample_count - HoldStart >= timecent_to_sec(HoldTime) * SampleRate)
		{
			stage = SF2_DECAY;
			return Update(v);
		}
		return 0;

	case SF2_DECAY:
		sec = timecent_to_sec(DecayTime);
		if (sec <= 0)
		{ // instantaneous decay
			newvolume = SustainLevel;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= SustainLevel)
		{
			newvolume = SustainLevel;
			stage = SF2_SUSTAIN;
			bUpdating = false;
			if (!(v->status & VOICE_RELEASING))
			{
				v->status |= VOICE_SUSTAINING;
			}
		}
		break;

	case SF2_SUSTAIN:
		// Stay here until released.
		return 0;

	case SF2_RELEASE:
		sec = timecent_to_sec(ReleaseTime);
		if (sec <= 0)
		{ // instantaneous release
			newvolume = 1000;
		}
		else
		{
			newvolume = volume + calc_rate(RateMul_cB, sec);
		}
		if (newvolume >= 960)
		{
			stage = SF2_FINISHED;
			shutoff_voice(v);
			bUpdating = false;
			return 1;
		}
		break;

	case SF2_FINISHED:
		return 1;
	}
	volume = (float)newvolume;
	return 0;
}